

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# atoi.h
# Opt level: O2

unsigned_long jsteemann::atoi_positive<unsigned_long>(char *p,char *e,int *errcode)

{
  byte bVar1;
  unsigned_long uVar2;
  int iVar3;
  
  iVar3 = -1;
  if (p == e) {
    uVar2 = 0;
    iVar3 = -1;
  }
  else {
    uVar2 = 0;
    do {
      bVar1 = *p;
      if (((ulong)bVar1 < 0x21) && ((0x100003e01U >> ((ulong)bVar1 & 0x3f) & 1) != 0)) break;
      if ((byte)(bVar1 - 0x3a) < 0xf6) goto LAB_002cdf61;
      if ((0x1999999999999999 < uVar2) || (uVar2 == 0x1999999999999999 && 5 < (byte)(bVar1 - 0x30)))
      {
        iVar3 = -3;
        goto LAB_002cdf61;
      }
      uVar2 = (ulong)(byte)(bVar1 - 0x30) + uVar2 * 10;
      p = (char *)((byte *)p + 1);
    } while (p < e);
    iVar3 = 0;
  }
LAB_002cdf61:
  *errcode = iVar3;
  return uVar2;
}

Assistant:

inline T atoi_positive(char const* p, char const* e, int& errcode) JSTEEMANN_NOEXCEPT {
  if (ATOI_UNLIKELY(p == e)) {
    errcode = -1;
    return T();
  }

  constexpr T cutoff = (std::numeric_limits<T>::max)() / 10;
  constexpr char cutlim = (std::numeric_limits<T>::max)() % 10;
  T result = 0;

  do {
    char c = *p;

    if ((c == '\0') || (c == ' ') || (c == '\t') || (c == '\n') || (c == '\r') || (c == '\v') || (c == '\f')) {
      errcode = 0;
      return result;
    }

    // we expect only '0' to '9'. everything else is unexpected
    if (ATOI_UNLIKELY(c < '0' || c > '9')) {
      errcode = -1;
      return result;
    }

    c -= '0';
    // we expect the bulk of values to not hit the bounds restrictions
    if (ATOI_UNLIKELY(result > cutoff || (result == cutoff && c > cutlim))) {
      errcode = -3;
      return result;
    }
    result *= 10;
    result += c;
  } while (++p < e);

  errcode = 0;
  return result;
}